

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O0

void PMurHash32_test(void *key,int len,uint32_t seed,void *out)

{
  uint32_t uVar1;
  uchar *end;
  uchar *ptr;
  uint32_t carry;
  uint32_t h1;
  void *out_local;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  
  ptr._0_4_ = 0;
  ptr._4_4_ = seed;
  _carry = (uint32_t *)out;
  out_local._0_4_ = seed;
  out_local._4_4_ = len;
  _seed_local = key;
  PMurHash32_Process((uint32_t *)((long)&ptr + 4),(uint32_t *)&ptr,key,len);
  uVar1 = PMurHash32_Result(ptr._4_4_,(uint32_t)ptr,out_local._4_4_);
  *_carry = uVar1;
  return;
}

Assistant:

void PMurHash32_test(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t h1=seed, carry=0;
  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end = ptr + len;

#if 0 /* Exercise the progressive processing */
  while(ptr < end) {
    //const uint8_t *mid = ptr + rand()%(end-ptr)+1;
    const uint8_t *mid = ptr + (rand()&0xF);
    mid = mid<end?mid:end;
    PMurHash32_Process(&h1, &carry, ptr, mid-ptr);
    ptr = mid;
  }
#else
  PMurHash32_Process(&h1, &carry, ptr, (int)(end-ptr));
#endif
  h1 = PMurHash32_Result(h1, carry, len);
  *(uint32_t*)out = h1;
}